

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

VOID FreeLibraryAndExitThread(HMODULE hLibModule,DWORD dwExitCode)

{
  DWORD dwExitCode_local;
  HMODULE hLibModule_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  FreeLibrary(hLibModule);
  ExitThread(dwExitCode);
}

Assistant:

PALIMPORT
VOID
PALAPI
FreeLibraryAndExitThread(
    IN HMODULE hLibModule,
    IN DWORD dwExitCode)
{
    PERF_ENTRY(FreeLibraryAndExitThread);
    ENTRY("FreeLibraryAndExitThread()\n");
    FreeLibrary(hLibModule);
    ExitThread(dwExitCode);
    LOGEXIT("FreeLibraryAndExitThread\n");
    PERF_EXIT(FreeLibraryAndExitThread);
}